

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O1

REF_STATUS ref_mpi_allsum(REF_MPI ref_mpi,void *value,REF_INT n,REF_TYPE type)

{
  uint uVar1;
  REF_MPI __dest;
  undefined8 uVar2;
  REF_MPI ref_mpi_00;
  char *pcVar3;
  size_t __n;
  
  if (type == 3) {
    if (n < 0) {
      pcVar3 = "malloc temp of REF_DBL negative";
      uVar2 = 0x355;
      goto LAB_0021d90d;
    }
    ref_mpi_00 = (REF_MPI)((ulong)(uint)n * 8);
    __dest = (REF_MPI)malloc((size_t)ref_mpi_00);
    if (__dest == (REF_MPI)0x0) {
      pcVar3 = "malloc temp of REF_DBL NULL";
      uVar2 = 0x355;
      goto LAB_0021d95f;
    }
LAB_0021d7f4:
    if (n == 0) goto LAB_0021d80d;
    __n = (ulong)(uint)n << 3;
  }
  else {
    if (type == 2) {
      if (n < 0) {
        pcVar3 = "malloc temp of REF_LONG negative";
        uVar2 = 0x351;
        goto LAB_0021d90d;
      }
      ref_mpi_00 = (REF_MPI)((ulong)(uint)n * 8);
      __dest = (REF_MPI)malloc((size_t)ref_mpi_00);
      if (__dest == (REF_MPI)0x0) {
        pcVar3 = "malloc temp of REF_LONG NULL";
        uVar2 = 0x351;
        goto LAB_0021d95f;
      }
      goto LAB_0021d7f4;
    }
    if (type != 1) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x359,
             "ref_mpi_allsum",6,"data type");
      return 6;
    }
    if (n < 0) {
      pcVar3 = "malloc temp of REF_INT negative";
      uVar2 = 0x34d;
LAB_0021d90d:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar2,
             "ref_mpi_allsum",pcVar3);
      return 1;
    }
    ref_mpi_00 = (REF_MPI)((ulong)(uint)n * 4);
    __dest = (REF_MPI)malloc((size_t)ref_mpi_00);
    if (__dest == (REF_MPI)0x0) {
      pcVar3 = "malloc temp of REF_INT NULL";
      uVar2 = 0x34d;
LAB_0021d95f:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar2,
             "ref_mpi_allsum",pcVar3);
      return 2;
    }
    if (n == 0) goto LAB_0021d80d;
    __n = (ulong)(uint)n << 2;
  }
  ref_mpi_00 = __dest;
  memcpy(__dest,value,__n);
LAB_0021d80d:
  uVar1 = ref_mpi_sum(ref_mpi_00,__dest,value,n,type);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x35b,
           "ref_mpi_allsum",(ulong)uVar1,"sum");
    return uVar1;
  }
  free(__dest);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allsum(REF_MPI ref_mpi, void *value, REF_INT n,
                                  REF_TYPE type) {
  REF_INT i;
  void *temp = NULL;
  switch (type) {
    case REF_INT_TYPE:
      ref_malloc(temp, n, REF_INT);
      for (i = 0; i < n; i++) ((REF_INT *)temp)[i] = ((REF_INT *)value)[i];
      break;
    case REF_LONG_TYPE:
      ref_malloc(temp, n, REF_LONG);
      for (i = 0; i < n; i++) ((REF_LONG *)temp)[i] = ((REF_LONG *)value)[i];
      break;
    case REF_DBL_TYPE:
      ref_malloc(temp, n, REF_DBL);
      for (i = 0; i < n; i++) ((REF_DBL *)temp)[i] = ((REF_DBL *)value)[i];
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }
  RSS(ref_mpi_sum(ref_mpi, temp, value, n, type), "sum");
  ref_free(temp);
  RSS(ref_mpi_bcast(ref_mpi, value, n, type), "bcast")
  return REF_SUCCESS;
}